

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O1

string * __thiscall
cs222::Pass2::run(string *__return_storage_ptr__,Pass2 *this,string *srcFileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Map_pointer ppuVar3;
  pointer pcVar4;
  size_t *psVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  undefined8 uVar11;
  size_t __val;
  undefined8 *puVar12;
  _Map_pointer ppuVar13;
  size_t sVar14;
  size_type *psVar15;
  ulong *puVar16;
  Pass2 *this_00;
  string instObjCode;
  unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> instruction;
  size_t iAddress;
  string line;
  string __str_1;
  string buffer;
  string progName;
  IntermediateParser iParser;
  stringstream lineStream;
  string progLength;
  ifstream ifs;
  string local_7f8;
  string local_7d8;
  undefined1 local_7b8 [56];
  _Base_bitset<1UL> local_780;
  __uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_> local_778;
  undefined1 local_770;
  undefined7 uStack_76f;
  string local_760;
  long *local_740;
  uint local_738;
  long local_730 [2];
  char *local_720;
  undefined8 local_718;
  char local_710;
  undefined7 uStack_70f;
  deque<unsigned_long,std::allocator<unsigned_long>> *local_700;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6f8;
  string local_6f0;
  IntermediateParser local_6d0;
  undefined1 local_688 [128];
  ios_base local_608 [264];
  undefined1 local_500 [128];
  ios_base local_480 [264];
  long local_378 [65];
  Instruction local_170;
  
  local_7b8._48_8_ = __return_storage_ptr__;
  std::__cxx11::string::_M_assign((string *)&this->srcFileName);
  local_7b8._8_8_ = this;
  readSymbols(this);
  ppuVar3 = (_Map_pointer)(local_688 + 0x10);
  pcVar4 = (srcFileName->_M_dataplus)._M_p;
  local_688._0_8_ = ppuVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_688,pcVar4,pcVar4 + srcFileName->_M_string_length);
  std::__cxx11::string::append((char *)local_688);
  this_00 = (Pass2 *)local_688;
  std::ifstream::ifstream(local_378,(string *)this_00,_S_in);
  if ((_Map_pointer)local_688._0_8_ != ppuVar3) {
    this_00 = (Pass2 *)(local_688._16_8_ + 1);
    operator_delete((void *)local_688._0_8_,(ulong)this_00);
  }
  parseProgramName_abi_cxx11_(&local_6f0,this_00,(ifstream *)local_378);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500,
                 "Program name is \'",&local_6f0);
  plVar10 = (long *)std::__cxx11::string::append(local_500);
  ppuVar13 = (_Map_pointer)(plVar10 + 2);
  if ((_Map_pointer)*plVar10 == ppuVar13) {
    local_688._16_8_ = *ppuVar13;
    local_688._24_8_ = plVar10[3];
    local_688._0_8_ = ppuVar3;
  }
  else {
    local_688._16_8_ = *ppuVar13;
    local_688._0_8_ = (_Map_pointer)*plVar10;
  }
  local_688._8_8_ = plVar10[1];
  *plVar10 = (long)ppuVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  logDebug((string *)local_688);
  if ((_Map_pointer)local_688._0_8_ != ppuVar3) {
    operator_delete((void *)local_688._0_8_,local_688._16_8_ + 1);
  }
  if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
    operator_delete((void *)local_500._0_8_,(ulong)(local_500._16_8_ + 1));
  }
  IntermediateParser::IntermediateParser(&local_6d0,(istream *)local_378);
  local_780._M_w = (_WordT)&local_770;
  local_778._M_t.
  super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
  super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl =
       (tuple<cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>)
       (_Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>)0x0;
  local_770 = 0;
  std::istream::seekg(local_378,0,0);
  cVar7 = std::ios::widen((char)local_378 + (char)*(undefined8 *)(local_378[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_378,(string *)&local_780,cVar7);
  cVar7 = std::ios::widen((char)(istream *)local_378 + (char)*(undefined8 *)(local_378[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_378,(string *)&local_780,cVar7);
  uVar11 = std::istream::tellg();
  cVar7 = std::ios::widen((char)local_378 + (char)*(undefined8 *)(local_378[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_378,(string *)&local_780,cVar7);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_688,(string *)&local_780,_S_out|_S_in);
  local_720 = &local_710;
  local_718 = 0;
  local_710 = '\0';
  std::operator>>((istream *)local_688,(string *)&local_720);
  std::operator>>((istream *)local_688,(string *)&local_720);
  if (*local_720 == '.') {
    do {
      uVar11 = std::istream::tellg();
      cVar7 = std::ios::widen((char)*(undefined8 *)(local_378[0] + -0x18) +
                              (char)(istream *)local_378);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_378,(string *)&local_780,cVar7);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_500,(string *)&local_780,_S_out|_S_in);
      std::__cxx11::stringstream::operator=((stringstream *)local_688,(stringstream *)local_500);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_500);
      std::ios_base::~ios_base(local_480);
      std::operator>>((istream *)local_688,(string *)&local_720);
      std::operator>>((istream *)local_688,(string *)&local_720);
    } while (*local_720 == '.');
  }
  std::istream::seekg(local_378,uVar11,0);
  IntermediateParser::next((IntermediateParser *)local_7b8);
  if ((Pass2 *)local_7b8._0_8_ != (Pass2 *)0x0) {
    paVar1 = &local_7d8.field_2;
    paVar2 = &local_7f8.field_2;
    local_6f8 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_7b8._8_8_ + 0x50);
    local_700 = (deque<unsigned_long,std::allocator<unsigned_long>> *)(local_7b8._8_8_ + 0xa0);
    do {
      Instruction::Instruction((Instruction *)local_500,(Instruction *)local_7b8._0_8_);
      __val = Instruction::getAddress((Instruction *)local_500);
      cVar7 = '\x01';
      if (9 < __val) {
        sVar14 = __val;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (sVar14 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_0011a53b;
          }
          if (sVar14 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_0011a53b;
          }
          if (sVar14 < 10000) goto LAB_0011a53b;
          bVar8 = 99999 < sVar14;
          sVar14 = sVar14 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar8);
        cVar7 = cVar7 + '\x01';
      }
LAB_0011a53b:
      local_740 = local_730;
      std::__cxx11::string::_M_construct((ulong)&local_740,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_740,local_738,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,0x1360ab);
      local_7b8._16_8_ = local_7b8 + 0x20;
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar15) {
        local_7b8._32_8_ = *psVar15;
        local_7b8._40_8_ = plVar10[3];
      }
      else {
        local_7b8._32_8_ = *psVar15;
        local_7b8._16_8_ = (size_type *)*plVar10;
      }
      local_7b8._24_8_ = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_7b8 + 0x10);
      puVar16 = (ulong *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_7d8.field_2._M_allocated_capacity = *puVar16;
        local_7d8.field_2._8_8_ = plVar10[3];
        local_7d8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_7d8.field_2._M_allocated_capacity = *puVar16;
        local_7d8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_7d8._M_string_length = plVar10[1];
      *plVar10 = (long)puVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      Instruction::getOperandsToken_abi_cxx11_(&local_760,(Instruction *)local_500);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar1) {
        uVar11 = local_7d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_760._M_string_length + local_7d8._M_string_length) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._M_dataplus._M_p != &local_760.field_2) {
          uVar11 = local_760.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_760._M_string_length + local_7d8._M_string_length)
        goto LAB_0011a688;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_760,0,(char *)0x0,(ulong)local_7d8._M_dataplus._M_p);
      }
      else {
LAB_0011a688:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_7d8,(ulong)local_760._M_dataplus._M_p);
      }
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8.field_2._8_8_ = puVar12[3];
        local_7f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_7f8._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)psVar15 = 0;
      logDebug(&local_7f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._M_dataplus._M_p != &local_760.field_2) {
        operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_7b8._16_8_ != local_7b8 + 0x20) {
        operator_delete((void *)local_7b8._16_8_,local_7b8._32_8_ + 1);
      }
      if (local_740 != local_730) {
        operator_delete(local_740,local_730[0] + 1);
      }
      local_7b8._16_8_ = Instruction::getAddress((Instruction *)local_500);
      Instruction::getOperation_abi_cxx11_(&local_7d8,(Instruction *)local_500);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_7d8,0,(char *)0x0,0x1360c7);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8.field_2._8_8_ = plVar10[3];
        local_7f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_7f8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      logDebug(&local_7f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      Instruction::getOperandsToken_abi_cxx11_(&local_7d8,(Instruction *)local_500);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_7d8,0,(char *)0x0,0x1360d3);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8.field_2._8_8_ = plVar10[3];
        local_7f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_7f8.field_2._M_allocated_capacity = *psVar15;
        local_7f8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_7f8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      logDebug(&local_7f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      Instruction::Instruction(&local_170,(Instruction *)local_500);
      translate_abi_cxx11_(&local_7f8,(Pass2 *)local_7b8._8_8_,&local_170);
      Instruction::~Instruction(&local_170);
      std::operator+(&local_7d8,"Object Code: ",&local_7f8);
      logDebug(&local_7d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_6f8,&local_7f8);
      psVar5 = (((deque<unsigned_long,_std::allocator<unsigned_long>_> *)(local_7b8._8_8_ + 0xa0))->
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (psVar5 == (((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (local_7b8._8_8_ + 0xa0))->
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>(local_700,(unsigned_long *)(local_7b8 + 0x10));
      }
      else {
        *psVar5 = local_7b8._16_8_;
        (((deque<unsigned_long,_std::allocator<unsigned_long>_> *)(local_7b8._8_8_ + 0xa0))->
        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_cur = psVar5 + 1;
      }
      local_7d8._M_dataplus._M_p = local_7d8._M_dataplus._M_p & 0xffffffff00000000;
      bVar8 = Instruction::isSet((Instruction *)local_500,(Flag *)&local_7d8);
      if (bVar8) {
        psVar5 = (((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b8._8_8_)->
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (psVar5 == (((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b8._8_8_)->
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)local_7b8._8_8_,
                     (unsigned_long *)(local_7b8 + 0x10));
        }
        else {
          *psVar5 = local_7b8._16_8_;
          (((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b8._8_8_)->
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_cur = psVar5 + 1;
        }
      }
      IntermediateParser::next((IntermediateParser *)&local_7d8);
      uVar11 = local_7b8._0_8_;
      local_7b8._0_8_ = local_7d8._M_dataplus._M_p;
      local_7d8._M_dataplus._M_p = (pointer)0x0;
      if ((_Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>)uVar11
          != (Instruction *)0x0) {
        Instruction::~Instruction((Instruction *)uVar11);
        operator_delete((void *)uVar11,0x140);
      }
      std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
                ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
                 &local_7d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
      }
      Instruction::~Instruction((Instruction *)local_500);
    } while ((_Head_base<0UL,_cs222::Instruction_*,_false>)local_7b8._0_8_ !=
             (_Head_base<0UL,_cs222::Instruction_*,_false>)0x0);
  }
  parseProgramLength_abi_cxx11_((string *)local_500,(Pass2 *)local_7b8._0_8_,(ifstream *)local_378);
  std::operator+(&local_7d8,"Program is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500);
  uVar11 = local_7b8._8_8_;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_7d8);
  paVar1 = &local_7f8.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_7f8.field_2._M_allocated_capacity = *psVar15;
    local_7f8.field_2._8_8_ = plVar10[3];
    local_7f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_7f8.field_2._M_allocated_capacity = *psVar15;
    local_7f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_7f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  logDebug(&local_7f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  iVar9 = std::__cxx11::string::compare((char *)(uVar11 + 0xf0));
  if (iVar9 == 0) {
    local_7f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7f8,"Dumping Modification Addresses","");
    logDebug(&local_7f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    dumpDeque((deque<unsigned_long,_std::allocator<unsigned_long>_> *)uVar11);
    local_7f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"Dumping Object Codes","");
    logDebug(&local_7f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    dumpDeque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(uVar11 + 0x50));
    local_7f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7f8,"Dumping Corresponding Addressses","");
    logDebug(&local_7f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    dumpDeque((deque<unsigned_long,_std::allocator<unsigned_long>_> *)(uVar11 + 0xa0));
    writeObjectProgram((Pass2 *)uVar11,&local_6f0,(string *)local_500);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)local_7b8._48_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_7b8._48_8_ + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7b8._48_8_,"Pass 2 finished successfully","");
  }
  else {
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)local_7b8._48_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_7b8._48_8_ + 0x10);
    pcVar4 = (((string *)(uVar11 + 0xf0))->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_7b8._48_8_,pcVar4,
               pcVar4 + ((string *)(uVar11 + 0xf0))->_M_string_length);
  }
  if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
    operator_delete((void *)local_500._0_8_,(ulong)(local_500._16_8_ + 1));
  }
  std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
            ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)local_7b8);
  if (local_720 != &local_710) {
    operator_delete(local_720,CONCAT71(uStack_70f,local_710) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_688);
  std::ios_base::~ios_base(local_608);
  if ((undefined1 *)local_780._M_w != &local_770) {
    operator_delete((void *)local_780._M_w,CONCAT71(uStack_76f,local_770) + 1);
  }
  local_6d0.super_Parser._vptr_Parser = (_func_int **)&PTR_next_001446a0;
  std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
            (&local_6d0.super_Parser.nextInstruction);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.super_Parser.line._M_dataplus._M_p != &local_6d0.super_Parser.line.field_2) {
    operator_delete(local_6d0.super_Parser.line._M_dataplus._M_p,
                    local_6d0.super_Parser.line.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_378);
  return (string *)local_7b8._48_8_;
}

Assistant:

std::string Pass2::run(std::string srcFileName) {
        Pass2::srcFileName = srcFileName;

        readSymbols();

        std::ifstream ifs(srcFileName + ".listing");

        std::string progName = parseProgramName(ifs);
        logDebug("Program name is '" + progName + "'");

        cs222::IntermediateParser iParser(ifs);

        std::string line;
        ifs.seekg(0);
        getline(ifs, line); // Skip first line (column names).
        getline(ifs, line); // Skip the second line (empty line).
        size_t startInst = ifs.tellg();
        getline(ifs, line);

        // Skip comment lines
        std::stringstream lineStream(line);
        std::string buffer;
        lineStream >> buffer; // Skip line number.
        lineStream >> buffer; // Skip address.
        while (buffer[0] == '.')
        {
            startInst = ifs.tellg();
            getline(ifs, line);
            lineStream = std::stringstream(line);
            lineStream >> buffer; // Skip line number.
            lineStream >> buffer; // Skip address.
        }
        ifs.seekg(startInst);

        std::unique_ptr<cs222::Instruction> instruction = iParser.next();
        while (instruction != nullptr) {
            Instruction i = *instruction;
            logDebug("Operands in instruction at " +
                    std::to_string(i.getAddress()) + ": " +
                    i.getOperandsToken());
            const size_t iAddress = i.getAddress();
            logDebug("Operation: " + i.getOperation());
            logDebug("Operands: " + i.getOperandsToken());
            std::string instObjCode = translate(i);
            logDebug("Object Code: " + instObjCode);
            objectCode.push_back(instObjCode);
            correspondingAddresses.push_back(iAddress);
            if (i.isSet(i.FLAG_EXTENDED)) {
                modificationAddresses.push_back(iAddress);
            }
            instruction = iParser.next();
        }

        std::string progLength = parseProgramLength(ifs);
        logDebug("Program is " + progLength + " bytes long");

        if (errorReportMessage == "") {
            logDebug("Dumping Modification Addresses");
            dumpDeque(modificationAddresses);
            logDebug("Dumping Object Codes");
            dumpDeque(objectCode);
            logDebug("Dumping Corresponding Addressses");
            dumpDeque(correspondingAddresses);
            writeObjectProgram(progName, progLength);
            return "Pass 2 finished successfully";
        } else {
            return errorReportMessage;
        }
    }